

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O1

void __thiscall
chrono::robosimian::RS_Limb::Initialize
          (RS_Limb *this,shared_ptr<chrono::ChBodyAuxRef> *chassis,ChVector<double> *xyz,
          ChVector<double> *rpy,Enum collision_family,ActuationMode wheel_mode)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  long lVar1;
  RS_Part *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pcVar3;
  element_type *peVar4;
  int iVar5;
  iterator iVar6;
  long lVar7;
  undefined1 *puVar8;
  ChLinkLockLock *this_01;
  long *plVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  double *pdVar10;
  size_t size;
  shared_ptr<chrono::ChLinkLockLock> joint;
  shared_ptr<chrono::ChBodyAuxRef> child_body;
  shared_ptr<chrono::ChBodyAuxRef> parent_body;
  ChFrame<double> X_GP;
  ChFrame<double> X_GC;
  ChFrame<double> X_PC;
  shared_ptr<chrono::ChLinkLockLock> local_598;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_588;
  undefined1 local_580 [16];
  _func_int *p_Stack_570;
  double dStack_568;
  RS_Limb *local_560;
  ChFrame *local_558;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_550;
  element_type *local_548;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_540;
  shared_ptr<chrono::ChBodyAuxRef> *local_538;
  Enum local_52c;
  undefined1 local_528 [32];
  element_type *local_508;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_500;
  _func_int *p_Stack_4f8;
  double dStack_4f0;
  ChMatrix33<double> local_4e8;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_4a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_498;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_490;
  _func_int **local_488;
  _func_int **local_480;
  ActuationMode local_474;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_470;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_468;
  ChLinkLockLock *local_460;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_458;
  shared_ptr<chrono::ChFunction> local_450;
  ChFrame *local_440;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_438;
  element_type *local_430;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_428;
  ChLinkLockLock *local_420;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_418;
  ChFrame *local_410;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_408;
  element_type *local_400;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3f8;
  ChLinkLockLock *local_3f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3e8;
  shared_ptr<chrono::ChFunction> local_3e0;
  ChFrame *local_3d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3c8;
  element_type *local_3c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3b8;
  ChLinkLockLock *local_3b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3a8;
  ChFrame *local_3a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_398;
  element_type *local_390;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_388;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_380;
  undefined **local_378;
  shared_ptr<chrono::ChFunction> local_370;
  undefined1 local_360 [32];
  double local_340;
  double local_338;
  double local_330;
  double local_328;
  double local_320;
  double dStack_318;
  double dStack_310;
  double dStack_308;
  double dStack_300;
  double dStack_2f8;
  double dStack_2f0;
  double dStack_2e8;
  double local_2e0;
  ChFrame<double> local_2d8;
  ChFrame<double> local_250;
  ChFrame<double> local_1c8;
  ChFrame<double> local_140;
  ChFrame<double> local_b8;
  
  local_548 = (chassis->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_540._M_pi =
       (chassis->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_540._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_540._M_pi)->_M_use_count = (local_540._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_540._M_pi)->_M_use_count = (local_540._M_pi)->_M_use_count + 1;
    }
  }
  local_560 = this;
  local_538 = chassis;
  local_52c = collision_family;
  local_474 = wheel_mode;
  local_360._0_8_ = local_360 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"link0","");
  local_468 = &(local_560->m_links)._M_h;
  iVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(local_468,(key_type *)local_360);
  local_558 = *(ChFrame **)
               (*(long *)((long)iVar6.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_true>
                                ._M_cur + 0x28) + 0x28);
  local_550._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
        (*(long *)((long)iVar6.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_true>
                         ._M_cur + 0x28) + 0x30);
  if (local_550._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_550._M_pi)->_M_use_count = (local_550._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_550._M_pi)->_M_use_count = (local_550._M_pi)->_M_use_count + 1;
    }
  }
  if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
    operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
  }
  lVar7 = (**(code **)(*(long *)local_548 + 0x1f0))();
  local_360._0_8_ = &PTR__ChFrame_0017db90;
  local_360._8_8_ = *(double *)(lVar7 + 8);
  local_360._16_8_ = *(size_type *)(lVar7 + 0x10);
  local_360._24_8_ = *(undefined8 *)(lVar7 + 0x18);
  local_340 = *(double *)(lVar7 + 0x20);
  local_338 = *(double *)(lVar7 + 0x28);
  local_330 = *(double *)(lVar7 + 0x30);
  local_328 = *(double *)(lVar7 + 0x38);
  local_320 = *(double *)(lVar7 + 0x40);
  dStack_318 = *(double *)(lVar7 + 0x48);
  dStack_310 = *(double *)(lVar7 + 0x50);
  dStack_308 = *(double *)(lVar7 + 0x58);
  dStack_300 = *(double *)(lVar7 + 0x60);
  dStack_2f8 = *(double *)(lVar7 + 0x68);
  dStack_2f0 = *(double *)(lVar7 + 0x70);
  dStack_2e8 = *(double *)(lVar7 + 0x78);
  local_2e0 = *(double *)(lVar7 + 0x80);
  rpy2quat((ChQuaternion<double> *)&local_2d8,rpy);
  local_250._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0017db90;
  local_250.coord.pos.m_data[0] = xyz->m_data[0];
  local_250.coord.pos.m_data[1] = xyz->m_data[1];
  local_250.coord.pos.m_data[2] = xyz->m_data[2];
  local_250.coord.rot.m_data[0] = (double)local_2d8._vptr_ChFrame;
  local_250.coord.rot.m_data[1] = local_2d8.coord.pos.m_data[0];
  local_250.coord.rot.m_data[2] = local_2d8.coord.pos.m_data[1];
  local_250.coord.rot.m_data[3] = local_2d8.coord.pos.m_data[2];
  ChMatrix33<double>::ChMatrix33(&local_250.Amatrix,(ChQuaternion<double> *)&local_2d8);
  ChFrame<double>::operator*(&local_2d8,(ChFrame<double> *)local_360,&local_250);
  local_378 = &PTR__ChFrame_0017db90;
  chrono::ChBodyAuxRef::SetFrame_REF_to_abs(local_558);
  local_380 = &(local_538->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount;
  local_4a0 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               *)&local_560->m_joints;
  local_490 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               *)&local_560->m_motors;
  local_470 = &(local_560->m_wheel_motor).
               super___shared_ptr<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
  local_480 = (_func_int **)&PTR___Sp_counted_ptr_inplace_0017e7e0;
  local_488 = (_func_int **)chrono::ChLinkMarkers::Initialize;
  lVar7 = 0;
  do {
    iVar6 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(local_468,(key_type *)(&DAT_00182990 + lVar7));
    lVar1 = *(long *)((long)iVar6.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_true>
                            ._M_cur + 0x28);
    local_498 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)iVar6.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_true>
                        ._M_cur + 0x30);
    if (local_498 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_498->_M_use_count = local_498->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_498->_M_use_count = local_498->_M_use_count + 1;
      }
    }
    iVar6 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(local_468,(key_type *)(&DAT_001829b0 + lVar7));
    this_00 = *(RS_Part **)
               ((long)iVar6.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_true>
                      ._M_cur + 0x28);
    local_588 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)iVar6.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_true>
                        ._M_cur + 0x30);
    if (local_588 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_588->_M_use_count = local_588->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_588->_M_use_count = local_588->_M_use_count + 1;
      }
    }
    local_548 = *(element_type **)(lVar1 + 0x28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_540,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar1 + 0x30));
    local_558 = (ChFrame *)
                (this_00->m_body).
                super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_550,
               &(this_00->m_body).
                super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    puVar8 = (undefined1 *)(**(code **)(*(long *)local_548 + 0x1f0))();
    if (puVar8 != local_360) {
      local_360._8_8_ = *(undefined8 *)(puVar8 + 8);
      local_360._16_8_ = *(undefined8 *)(puVar8 + 0x10);
      local_360._24_8_ = *(undefined8 *)(puVar8 + 0x18);
      local_340 = *(double *)(puVar8 + 0x20);
      local_338 = *(double *)(puVar8 + 0x28);
      local_330 = *(double *)(puVar8 + 0x30);
      local_328 = *(double *)(puVar8 + 0x38);
      local_320 = *(double *)(puVar8 + 0x40);
      dStack_318 = *(double *)(puVar8 + 0x48);
      dStack_310 = *(double *)(puVar8 + 0x50);
      dStack_308 = *(double *)(puVar8 + 0x58);
      dStack_300 = *(double *)(puVar8 + 0x60);
      dStack_2f8 = *(double *)(puVar8 + 0x68);
      dStack_2f0 = *(double *)(puVar8 + 0x70);
      dStack_2e8 = *(double *)(puVar8 + 0x78);
      local_2e0 = *(double *)(puVar8 + 0x80);
    }
    rpy2quat((ChQuaternion<double> *)local_580,(ChVector<double> *)(&DAT_001829f0 + lVar7));
    local_528._0_8_ = local_378;
    local_528._8_8_ = *(undefined8 *)(&DAT_001829d8 + lVar7);
    local_528._16_8_ = *(undefined8 *)(&DAT_001829e0 + lVar7);
    local_528._24_8_ = *(double *)(lVar7 + 0x1829e8);
    local_508 = (element_type *)local_580._0_8_;
    _Stack_500._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_580._8_8_;
    p_Stack_4f8 = p_Stack_570;
    dStack_4f0 = dStack_568;
    ChMatrix33<double>::ChMatrix33(&local_4e8,(ChQuaternion<double> *)local_580);
    local_250.coord.pos.m_data[0] = (double)local_528._8_8_;
    local_250.coord.pos.m_data[1] = (double)local_528._16_8_;
    local_250.coord.pos.m_data[2] = (double)local_528._24_8_;
    local_250.coord.rot.m_data[0] = (double)local_508;
    local_250.coord.rot.m_data[1] = (double)_Stack_500._M_pi;
    local_250.coord.rot.m_data[2] = (double)p_Stack_4f8;
    local_250.coord.rot.m_data[3] = dStack_4f0;
    local_250.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         local_4e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_250.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         local_4e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_250.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         local_4e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_250.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         local_4e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    local_250.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         local_4e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    local_250.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         local_4e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    local_250.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         local_4e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    local_250.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         local_4e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    local_250.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         local_4e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    ChFrame<double>::operator*((ChFrame<double> *)local_528,(ChFrame<double> *)local_360,&local_250)
    ;
    local_2d8.coord.pos.m_data[0] = (double)local_528._8_8_;
    local_2d8.coord.pos.m_data[1] = (double)local_528._16_8_;
    local_2d8.coord.pos.m_data[2] = (double)local_528._24_8_;
    local_2d8.coord.rot.m_data[0] = (double)local_508;
    local_2d8.coord.rot.m_data[1] = (double)_Stack_500._M_pi;
    local_2d8.coord.rot.m_data[2] = (double)p_Stack_4f8;
    local_2d8.coord.rot.m_data[3] = dStack_4f0;
    local_2d8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         local_4e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_2d8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         local_4e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_2d8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         local_4e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_2d8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         local_4e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    local_2d8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         local_4e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    local_2d8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         local_4e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    local_2d8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         local_4e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    local_2d8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         local_4e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    local_2d8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         local_4e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    chrono::ChBodyAuxRef::SetFrame_REF_to_abs(local_558);
    if (lVar7 == 0) {
      local_548 = (local_538->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_540,local_380);
    }
    RS_Part::AddCollisionShapes(this_00);
    plVar9 = *(long **)(local_558 + 0x198);
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_558 + 0x1a0);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (**(code **)(*plVar9 + 200))(plVar9,local_52c);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    plVar9 = *(long **)(local_558 + 0x198);
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_558 + 0x1a0);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (**(code **)(*plVar9 + 0xd8))(plVar9,local_52c);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    size = (size_t)((&local_560->m_collide_links)
                    [this_00 ==
                     (local_560->m_wheel).
                     super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr] & 1);
    chrono::ChBody::SetCollide(SUB81(local_558,0));
    __x = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          ((long)&joints + lVar7);
    if ((&DAT_001829d0)[lVar7] == '\x01') {
      this_01 = (ChLinkLockLock *)ChLinkLock::operator_new((ChLinkLock *)0x1060,size);
      chrono::ChLinkLockLock::ChLinkLockLock(this_01);
      local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           this_01;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChLinkLockLock*>
                (&local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,this_01);
      peVar4 = local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_580._0_8_ = &p_Stack_570;
      pcVar3 = (local_560->m_name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_580,pcVar3,pcVar3 + (local_560->m_name)._M_string_length);
      std::__cxx11::string::append((char *)local_580);
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_580,*(ulong *)((long)&joints + lVar7));
      local_528._0_8_ = local_528 + 0x10;
      pdVar10 = (double *)(plVar9 + 2);
      if ((double *)*plVar9 == pdVar10) {
        local_528._16_8_ = *pdVar10;
        local_528._24_8_ = plVar9[3];
      }
      else {
        local_528._16_8_ = *pdVar10;
        local_528._0_8_ = (double *)*plVar9;
      }
      local_528._8_8_ = plVar9[1];
      *plVar9 = (long)pdVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::_M_assign((string *)(peVar4 + 8));
      if ((undefined1 *)local_528._0_8_ != local_528 + 0x10) {
        operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
      }
      if ((element_type *)local_580._0_8_ != (element_type *)&p_Stack_570) {
        operator_delete((void *)local_580._0_8_,(ulong)(p_Stack_570 + 1));
      }
      peVar4 = local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_390 = local_548;
      local_388 = local_540._M_pi;
      if (local_540._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_540._M_pi)->_M_use_count = (local_540._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_540._M_pi)->_M_use_count = (local_540._M_pi)->_M_use_count + 1;
        }
      }
      local_3a0 = local_558;
      local_398 = local_550._M_pi;
      if (local_550._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_550._M_pi)->_M_use_count = (local_550._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_550._M_pi)->_M_use_count = (local_550._M_pi)->_M_use_count + 1;
        }
      }
      calcJointFrame((ChCoordsys<double> *)local_528,&local_2d8,
                     (ChVector<double> *)(&DAT_00182a08 + lVar7));
      (**(code **)(*(long *)peVar4 + 0x250))
                (peVar4,&local_390,&local_3a0,
                 (allocator<chrono::ChLinkMotorRotationAngle> *)local_528);
      if (local_398 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_398);
      }
      if (local_388 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_388);
      }
      plVar9 = *(long **)((local_538->
                          super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr + 0x38);
      local_3b0 = local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
      local_3a8 = local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
      if (local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      (**(code **)(*plVar9 + 0x138))(plVar9,&local_3b0);
      if (local_3a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a8);
      }
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkLockLock>_>
      ::pair<std::shared_ptr<chrono::ChLinkLockLock>_&,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkLockLock>_>
                  *)local_528,__x,&local_598);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<chrono::ChLinkLockLock>>>
                (local_4a0,(allocator<chrono::ChLinkMotorRotationAngle> *)local_528);
      if (_Stack_500._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_500._M_pi);
      }
      if ((undefined1 *)local_528._0_8_ != local_528 + 0x10) {
        operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
      }
      this_02._M_pi =
           local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      goto LAB_00142cb8;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)__x);
      if (iVar5 == 0) {
        if (local_474 == SPEED) {
          this_02._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
          (this_02._M_pi)->_M_use_count = 1;
          (this_02._M_pi)->_M_weak_count = 1;
          (this_02._M_pi)->_vptr__Sp_counted_base = local_480;
          this_02._M_pi[1]._vptr__Sp_counted_base = local_488;
          this_02._M_pi[1]._M_use_count = 0;
          this_02._M_pi[1]._M_weak_count = 0;
          this_02._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
          this_02._M_pi[2]._M_use_count = 0;
          this_02._M_pi[2]._M_weak_count = 0;
          this_02._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
          this_02._M_pi[2]._M_use_count = 0;
          this_02._M_pi[2]._M_weak_count = 0;
          this_02._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
          this_02._M_pi[3]._M_use_count = 0;
          this_02._M_pi[3]._M_weak_count = 0;
          this_02._M_pi[4]._vptr__Sp_counted_base = (_func_int **)0x0;
          local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<chrono::ChLinkMotorRotationSpeed,std::allocator<chrono::ChLinkMotorRotationSpeed>>
                    (&local_598.
                      super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(ChLinkMotorRotationSpeed **)&local_598,
                     (_Sp_alloc_shared_tag<std::allocator<chrono::ChLinkMotorRotationSpeed>_>)
                     local_528);
          peVar4 = local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_580._0_8_ = &p_Stack_570;
          pcVar3 = (local_560->m_name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_580,pcVar3,pcVar3 + (local_560->m_name)._M_string_length);
          std::__cxx11::string::append((char *)local_580);
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)local_580,*(ulong *)((long)&joints + lVar7));
          local_528._0_8_ = local_528 + 0x10;
          pdVar10 = (double *)(plVar9 + 2);
          if ((double *)*plVar9 == pdVar10) {
            local_528._16_8_ = *pdVar10;
            local_528._24_8_ = plVar9[3];
          }
          else {
            local_528._16_8_ = *pdVar10;
            local_528._0_8_ = (double *)*plVar9;
          }
          local_528._8_8_ = plVar9[1];
          *plVar9 = (long)pdVar10;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::string::_M_assign((string *)(peVar4 + 8));
          if ((undefined1 *)local_528._0_8_ != local_528 + 0x10) {
            operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
          }
          if ((element_type *)local_580._0_8_ != (element_type *)&p_Stack_570) {
            operator_delete((void *)local_580._0_8_,(ulong)(p_Stack_570 + 1));
          }
          peVar4 = local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_400 = local_548 + 0x78;
          if (local_548 == (element_type *)0x0) {
            local_400 = (element_type *)0x0;
          }
          local_3f8 = local_540._M_pi;
          if (local_540._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_540._M_pi)->_M_use_count = (local_540._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_540._M_pi)->_M_use_count = (local_540._M_pi)->_M_use_count + 1;
            }
          }
          local_410 = local_558 + 0x78;
          if (local_558 == (ChFrame *)0x0) {
            local_410 = (ChFrame *)0x0;
          }
          local_408 = local_550._M_pi;
          if (local_550._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_550._M_pi)->_M_use_count = (local_550._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_550._M_pi)->_M_use_count = (local_550._M_pi)->_M_use_count + 1;
            }
          }
          calcJointFrame((ChCoordsys<double> *)local_528,&local_2d8,
                         (ChVector<double> *)(&DAT_00182a08 + lVar7));
          ChFrame<double>::ChFrame(&local_140,(ChCoordsys<double> *)local_528);
          (**(code **)(*(long *)peVar4 + 0x240))(peVar4,&local_400,&local_410,&local_140);
          if (local_408 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408);
          }
          if (local_3f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f8);
          }
          local_370.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)(this_02._M_pi + 1);
          if (__libc_single_threaded == '\0') {
            LOCK();
            (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
          }
          local_370.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = this_02._M_pi;
          ChLinkMotorRotationSpeed::SetSpeedFunction
                    ((ChLinkMotorRotationSpeed *)
                     local_598.
                     super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     &local_370);
          if (local_370.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_370.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          plVar9 = *(long **)((local_538->
                              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr + 0x38);
          local_420 = local_598.
                      super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_418 = local_598.
                      super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
          if (local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          (**(code **)(*plVar9 + 0x138))(plVar9,&local_420);
          if (local_418 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_418);
          }
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>
          ::pair<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_&,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>
                      *)local_528,__x,(shared_ptr<chrono::ChLinkMotorRotationSpeed> *)&local_598);
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotationSpeed>>>
                    (local_4a0,(ChCoordsys<double> *)local_528);
          if (_Stack_500._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_500._M_pi);
          }
          if ((undefined1 *)local_528._0_8_ != local_528 + 0x10) {
            operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
          }
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>
          ::pair<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_&,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>
                      *)local_528,__x,(shared_ptr<chrono::ChLinkMotorRotationSpeed> *)&local_598);
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotationSpeed>>>
                    (local_490,(ChCoordsys<double> *)local_528);
          if (_Stack_500._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_500._M_pi);
          }
          if ((undefined1 *)local_528._0_8_ != local_528 + 0x10) {
            operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
          }
          (local_560->m_wheel_motor).
          super___shared_ptr<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (local_470,
                     &local_598.
                      super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          if (local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_598.
                       super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          goto LAB_00142cb8;
        }
        this_02._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
        (this_02._M_pi)->_M_use_count = 1;
        (this_02._M_pi)->_M_weak_count = 1;
        (this_02._M_pi)->_vptr__Sp_counted_base = local_480;
        this_02._M_pi[1]._vptr__Sp_counted_base = local_488;
        this_02._M_pi[1]._M_use_count = 0;
        this_02._M_pi[1]._M_weak_count = 0;
        this_02._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_02._M_pi[2]._M_use_count = 0;
        this_02._M_pi[2]._M_weak_count = 0;
        this_02._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_02._M_pi[2]._M_use_count = 0;
        this_02._M_pi[2]._M_weak_count = 0;
        this_02._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_02._M_pi[3]._M_use_count = 0;
        this_02._M_pi[3]._M_weak_count = 0;
        this_02._M_pi[4]._vptr__Sp_counted_base = (_func_int **)0x0;
        local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<chrono::ChLinkMotorRotationAngle,std::allocator<chrono::ChLinkMotorRotationAngle>>
                  (&local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,(ChLinkMotorRotationAngle **)&local_598,
                   (allocator<chrono::ChLinkMotorRotationAngle> *)local_528);
        peVar4 = local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_580._0_8_ = &p_Stack_570;
        pcVar3 = (local_560->m_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_580,pcVar3,pcVar3 + (local_560->m_name)._M_string_length);
        std::__cxx11::string::append((char *)local_580);
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_580,*(ulong *)((long)&joints + lVar7));
        local_528._0_8_ = local_528 + 0x10;
        pdVar10 = (double *)(plVar9 + 2);
        if ((double *)*plVar9 == pdVar10) {
          local_528._16_8_ = *pdVar10;
          local_528._24_8_ = plVar9[3];
        }
        else {
          local_528._16_8_ = *pdVar10;
          local_528._0_8_ = (double *)*plVar9;
        }
        local_528._8_8_ = plVar9[1];
        *plVar9 = (long)pdVar10;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::_M_assign((string *)(peVar4 + 8));
        if ((undefined1 *)local_528._0_8_ != local_528 + 0x10) {
          operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
        }
        if ((element_type *)local_580._0_8_ != (element_type *)&p_Stack_570) {
          operator_delete((void *)local_580._0_8_,(ulong)(p_Stack_570 + 1));
        }
        peVar4 = local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_430 = local_548 + 0x78;
        if (local_548 == (element_type *)0x0) {
          local_430 = (element_type *)0x0;
        }
        local_428 = local_540._M_pi;
        if (local_540._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_540._M_pi)->_M_use_count = (local_540._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_540._M_pi)->_M_use_count = (local_540._M_pi)->_M_use_count + 1;
          }
        }
        local_440 = local_558 + 0x78;
        if (local_558 == (ChFrame *)0x0) {
          local_440 = (ChFrame *)0x0;
        }
        local_438 = local_550._M_pi;
        if (local_550._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_550._M_pi)->_M_use_count = (local_550._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_550._M_pi)->_M_use_count = (local_550._M_pi)->_M_use_count + 1;
          }
        }
        calcJointFrame((ChCoordsys<double> *)local_528,&local_2d8,
                       (ChVector<double> *)(&DAT_00182a08 + lVar7));
        ChFrame<double>::ChFrame(&local_1c8,(ChCoordsys<double> *)local_528);
        (**(code **)(*(long *)peVar4 + 0x240))(peVar4,&local_430,&local_440,&local_1c8);
        if (local_438 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_438);
        }
        if (local_428 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_428);
        }
        local_450.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(this_02._M_pi + 1);
        if (__libc_single_threaded == '\0') {
          LOCK();
          (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
        }
        local_450.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = this_02._M_pi;
        ChLinkMotorRotationAngle::SetAngleFunction
                  ((ChLinkMotorRotationAngle *)
                   local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,&local_450);
        if (local_450.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_450.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        plVar9 = *(long **)((local_538->
                            super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr + 0x38);
        local_460 = local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
        local_458 = local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
        if (local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        (**(code **)(*plVar9 + 0x138))(plVar9,&local_460);
        if (local_458 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_458);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
        ::pair<std::shared_ptr<chrono::ChLinkMotorRotationAngle>_&,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
                    *)local_528,__x,(shared_ptr<chrono::ChLinkMotorRotationAngle> *)&local_598);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotationAngle>>>
                  (local_4a0,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
                    *)local_528);
        if (_Stack_500._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_500._M_pi);
        }
        if ((undefined1 *)local_528._0_8_ != local_528 + 0x10) {
          operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
        ::pair<std::shared_ptr<chrono::ChLinkMotorRotationAngle>_&,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
                    *)local_528,__x,(shared_ptr<chrono::ChLinkMotorRotationAngle> *)&local_598);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotationAngle>>>
                  (local_490,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
                    *)local_528);
        if (_Stack_500._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_500._M_pi);
        }
        if ((undefined1 *)local_528._0_8_ != local_528 + 0x10) {
          operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
        }
        (local_560->m_wheel_motor).
        super___shared_ptr<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (local_470,
                   &local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
      else {
        this_02._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
        (this_02._M_pi)->_M_use_count = 1;
        (this_02._M_pi)->_M_weak_count = 1;
        (this_02._M_pi)->_vptr__Sp_counted_base = local_480;
        this_02._M_pi[1]._vptr__Sp_counted_base = local_488;
        this_02._M_pi[1]._M_use_count = 0;
        this_02._M_pi[1]._M_weak_count = 0;
        this_02._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_02._M_pi[2]._M_use_count = 0;
        this_02._M_pi[2]._M_weak_count = 0;
        this_02._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_02._M_pi[2]._M_use_count = 0;
        this_02._M_pi[2]._M_weak_count = 0;
        this_02._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_02._M_pi[3]._M_use_count = 0;
        this_02._M_pi[3]._M_weak_count = 0;
        this_02._M_pi[4]._vptr__Sp_counted_base = (_func_int **)0x0;
        local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<chrono::ChLinkMotorRotationAngle,std::allocator<chrono::ChLinkMotorRotationAngle>>
                  (&local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,(ChLinkMotorRotationAngle **)&local_598,
                   (allocator<chrono::ChLinkMotorRotationAngle> *)local_528);
        peVar4 = local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_580._0_8_ = &p_Stack_570;
        pcVar3 = (local_560->m_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_580,pcVar3,pcVar3 + (local_560->m_name)._M_string_length);
        std::__cxx11::string::append((char *)local_580);
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_580,*(ulong *)((long)&joints + lVar7));
        local_528._0_8_ = local_528 + 0x10;
        pdVar10 = (double *)(plVar9 + 2);
        if ((double *)*plVar9 == pdVar10) {
          local_528._16_8_ = *pdVar10;
          local_528._24_8_ = plVar9[3];
        }
        else {
          local_528._16_8_ = *pdVar10;
          local_528._0_8_ = (double *)*plVar9;
        }
        local_528._8_8_ = plVar9[1];
        *plVar9 = (long)pdVar10;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::_M_assign((string *)(peVar4 + 8));
        if ((undefined1 *)local_528._0_8_ != local_528 + 0x10) {
          operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
        }
        if ((element_type *)local_580._0_8_ != (element_type *)&p_Stack_570) {
          operator_delete((void *)local_580._0_8_,(ulong)(p_Stack_570 + 1));
        }
        peVar4 = local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_3c0 = local_548 + 0x78;
        if (local_548 == (element_type *)0x0) {
          local_3c0 = (element_type *)0x0;
        }
        local_3b8 = local_540._M_pi;
        if (local_540._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_540._M_pi)->_M_use_count = (local_540._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_540._M_pi)->_M_use_count = (local_540._M_pi)->_M_use_count + 1;
          }
        }
        local_3d0 = local_558 + 0x78;
        if (local_558 == (ChFrame *)0x0) {
          local_3d0 = (ChFrame *)0x0;
        }
        local_3c8 = local_550._M_pi;
        if (local_550._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_550._M_pi)->_M_use_count = (local_550._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_550._M_pi)->_M_use_count = (local_550._M_pi)->_M_use_count + 1;
          }
        }
        calcJointFrame((ChCoordsys<double> *)local_528,&local_2d8,
                       (ChVector<double> *)(&DAT_00182a08 + lVar7));
        ChFrame<double>::ChFrame(&local_b8,(ChCoordsys<double> *)local_528);
        (**(code **)(*(long *)peVar4 + 0x240))(peVar4,&local_3c0,&local_3d0,&local_b8);
        if (local_3c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c8);
        }
        if (local_3b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b8);
        }
        local_3e0.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(this_02._M_pi + 1);
        if (__libc_single_threaded == '\0') {
          LOCK();
          (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
        }
        local_3e0.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = this_02._M_pi;
        ChLinkMotorRotationAngle::SetAngleFunction
                  ((ChLinkMotorRotationAngle *)
                   local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,&local_3e0);
        if (local_3e0.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_3e0.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        plVar9 = *(long **)((local_538->
                            super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr + 0x38);
        local_3f0 = local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
        local_3e8 = local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
        if (local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        (**(code **)(*plVar9 + 0x138))(plVar9,&local_3f0);
        if (local_3e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e8);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
        ::pair<std::shared_ptr<chrono::ChLinkMotorRotationAngle>_&,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
                    *)local_528,__x,(shared_ptr<chrono::ChLinkMotorRotationAngle> *)&local_598);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotationAngle>>>
                  (local_4a0,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
                    *)local_528);
        if (_Stack_500._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_500._M_pi);
        }
        if ((undefined1 *)local_528._0_8_ != local_528 + 0x10) {
          operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
        ::pair<std::shared_ptr<chrono::ChLinkMotorRotationAngle>_&,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
                    *)local_528,__x,(shared_ptr<chrono::ChLinkMotorRotationAngle> *)&local_598);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotationAngle>>>
                  (local_490,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
                    *)local_528);
        if (_Stack_500._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_500._M_pi);
        }
        if ((undefined1 *)local_528._0_8_ != local_528 + 0x10) {
          operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
        }
      }
      if (local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_598.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
LAB_00142cb8:
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
    }
    if (local_588 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_588);
    }
    if (local_498 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_498);
    }
    lVar7 = lVar7 + 0xb0;
    if (lVar7 == 0x6e0) {
      if (local_550._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_550._M_pi);
      }
      if (local_540._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_540._M_pi);
      }
      return;
    }
  } while( true );
}

Assistant:

void RS_Limb::Initialize(std::shared_ptr<ChBodyAuxRef> chassis,
                         const ChVector<>& xyz,
                         const ChVector<>& rpy,
                         CollisionFamily::Enum collision_family,
                         ActuationMode wheel_mode) {
    // Set absolute position of link0
    auto parent_body = chassis;                               // parent body
    auto child_body = m_links.find("link0")->second->m_body;  // child body
    ChFrame<> X_GP = parent_body->GetFrame_REF_to_abs();      // global -> parent
    ChFrame<> X_PC(xyz, rpy2quat(rpy));                       // parent -> child
    ChFrame<> X_GC = X_GP * X_PC;                             // global -> child
    child_body->SetFrame_REF_to_abs(X_GC);

    // Traverse chain (base-to-tip)
    //   set absolute position of the child body
    //   add collision shapes on child body
    //   create joint between parent and child
    for (int i = 0; i < num_joints; i++) {
        auto parent = m_links.find(joints[i].linkA)->second;       // parent part
        auto child = m_links.find(joints[i].linkB)->second;        // child part
        parent_body = parent->m_body;                              // parent body
        child_body = child->m_body;                                // child body
        X_GP = parent_body->GetFrame_REF_to_abs();                 // global -> parent
        X_PC = ChFrame<>(joints[i].xyz, rpy2quat(joints[i].rpy));  // parent -> child
        X_GC = X_GP * X_PC;                                        // global -> child
        child_body->SetFrame_REF_to_abs(X_GC);

        // First joint connects directly to chassis
        if (i == 0)
            parent_body = chassis;

        // Add contact geometry to child body
        child->AddCollisionShapes();

        // Place all links from this limb in the same collision family
        child_body->GetCollisionModel()->SetFamily(collision_family);
        child_body->GetCollisionModel()->SetFamilyMaskNoCollisionWithFamily(collision_family);

        // Note: call this AFTER setting the collision family (required for Chrono::Multicore)
        if (child == m_wheel)
            child_body->SetCollide(m_collide_wheel);
        else
            child_body->SetCollide(m_collide_links);

        // Weld joints
        if (joints[i].fixed) {
            auto joint = chrono_types::make_shared<ChLinkLockLock>();
            joint->SetNameString(m_name + "_" + joints[i].name);
            joint->Initialize(parent_body, child_body, calcJointFrame(X_GC, joints[i].axis));
            chassis->GetSystem()->AddLink(joint);
            m_joints.insert(std::make_pair(joints[i].name, joint));
            continue;
        }

        // Actuated joints (except the wheel motor joint)
        if (joints[i].name.compare("joint8") != 0) {
            auto motor_fun = chrono_types::make_shared<ChFunction_Setpoint>();
            auto joint = chrono_types::make_shared<ChLinkMotorRotationAngle>();
            joint->SetNameString(m_name + "_" + joints[i].name);
            joint->Initialize(parent_body, child_body, ChFrame<>(calcJointFrame(X_GC, joints[i].axis)));
            joint->SetAngleFunction(motor_fun);
            chassis->GetSystem()->AddLink(joint);
            m_joints.insert(std::make_pair(joints[i].name, joint));
            m_motors.insert(std::make_pair(joints[i].name, joint));
            continue;
        }

        // Wheel motor joint
        if (wheel_mode == ActuationMode::SPEED) {
            auto motor_fun = chrono_types::make_shared<ChFunction_Setpoint>();
            auto joint = chrono_types::make_shared<ChLinkMotorRotationSpeed>();
            joint->SetNameString(m_name + "_" + joints[i].name);
            joint->Initialize(parent_body, child_body, ChFrame<>(calcJointFrame(X_GC, joints[i].axis)));
            joint->SetSpeedFunction(motor_fun);
            chassis->GetSystem()->AddLink(joint);
            m_joints.insert(std::make_pair(joints[i].name, joint));
            m_motors.insert(std::make_pair(joints[i].name, joint));
            m_wheel_motor = joint;
        } else {
            auto motor_fun = chrono_types::make_shared<ChFunction_Setpoint>();
            auto joint = chrono_types::make_shared<ChLinkMotorRotationAngle>();
            joint->SetNameString(m_name + "_" + joints[i].name);
            joint->Initialize(parent_body, child_body, ChFrame<>(calcJointFrame(X_GC, joints[i].axis)));
            joint->SetAngleFunction(motor_fun);
            chassis->GetSystem()->AddLink(joint);
            m_joints.insert(std::make_pair(joints[i].name, joint));
            m_motors.insert(std::make_pair(joints[i].name, joint));
            m_wheel_motor = joint;
        }
    }
}